

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStringConst(PrintExpressionContents *this,StringConst *curr)

{
  String *this_00;
  bool bVar1;
  char *in_RCX;
  string_view str;
  string_view str_00;
  stringstream local_1c0 [8];
  stringstream wtf8;
  ostream local_1b0 [376];
  size_t local_38;
  ostream *local_30;
  
  str._M_str = "string.const ";
  str._M_len = 0xd;
  printMedium(this->o,str);
  std::__cxx11::stringstream::stringstream(local_1c0);
  bVar1 = String::convertWTF16ToWTF8(local_1b0,(curr->string).super_IString.str);
  if (bVar1) {
    this_00 = (String *)this->o;
    std::__cxx11::stringbuf::str();
    str_00._M_str = in_RCX;
    str_00._M_len = local_38;
    String::printEscaped(this_00,local_30,str_00);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::stringstream::~stringstream(local_1c0);
    return;
  }
  __assert_fail("valid",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                ,0x9c2,"void wasm::PrintExpressionContents::visitStringConst(StringConst *)");
}

Assistant:

void visitStringConst(StringConst* curr) {
    printMedium(o, "string.const ");
    // Re-encode from WTF-16 to WTF-8.
    std::stringstream wtf8;
    [[maybe_unused]] bool valid =
      String::convertWTF16ToWTF8(wtf8, curr->string.str);
    assert(valid);
    // TODO: Use wtf8.view() once we have C++20.
    String::printEscaped(o, wtf8.str());
  }